

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O2

void __thiscall wasm::RemoveNonJSOpsPass::visitBinary(RemoveNonJSOpsPass *this,Binary *curr)

{
  BinaryOp BVar1;
  Builder *this_00;
  Name target;
  size_t *psVar2;
  Call *expression;
  initializer_list<wasm::Expression_*> __l;
  Expression *local_78;
  Expression *pEStack_70;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_60;
  value_type local_48;
  allocator_type local_31;
  
  local_48.super_IString.str._M_len = 0;
  local_48.super_IString.str._M_str = (char *)0x0;
  BVar1 = curr->op;
  switch(BVar1) {
  case MulInt64:
    psVar2 = &WASM_I64_MUL;
    break;
  case DivSInt64:
    psVar2 = &WASM_I64_SDIV;
    break;
  case DivUInt64:
    psVar2 = &WASM_I64_UDIV;
    break;
  case RemSInt64:
    psVar2 = &WASM_I64_SREM;
    break;
  case RemUInt64:
    psVar2 = &WASM_I64_UREM;
    break;
  case AndInt64:
  case OrInt64:
  case XorInt64:
  case ShlInt64:
  case ShrSInt64:
  case ShrUInt64:
    goto switchD_00b519ff_caseD_20;
  case RotLInt64:
    psVar2 = &WASM_ROTL64;
    break;
  case RotRInt64:
    psVar2 = &WASM_ROTR64;
    break;
  default:
    if (BVar1 == RotLInt32) {
      psVar2 = &WASM_ROTL32;
    }
    else {
      if (BVar1 != RotRInt32) {
        if ((BVar1 != CopySignFloat64) && (BVar1 != CopySignFloat32)) {
          return;
        }
        rewriteCopysign(this,curr);
        return;
      }
      psVar2 = &WASM_ROTR32;
    }
  }
  local_48.super_IString.str._M_len = *psVar2;
  local_48.super_IString.str._M_str = (char *)psVar2[1];
  std::__detail::
  _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            *)&this->neededIntrinsics,&local_48);
  this_00 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  target.super_IString.str._M_str = local_48.super_IString.str._M_str;
  target.super_IString.str._M_len = local_48.super_IString.str._M_len;
  local_78 = curr->left;
  pEStack_70 = curr->right;
  __l._M_len = 2;
  __l._M_array = &local_78;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_60,__l,
             &local_31);
  expression = Builder::makeCall(this_00,target,
                                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 &local_60,
                                 (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)16>).
                                       super_Expression.type.id,false);
  Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
              ).
              super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
              .
              super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
             ,(Expression *)expression);
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            (&local_60);
switchD_00b519ff_caseD_20:
  return;
}

Assistant:

void visitBinary(Binary* curr) {
    Name name;
    switch (curr->op) {
      case CopySignFloat32:
      case CopySignFloat64:
        rewriteCopysign(curr);
        return;

      case RotLInt32:
        name = WASM_ROTL32;
        break;
      case RotRInt32:
        name = WASM_ROTR32;
        break;
      case RotLInt64:
        name = WASM_ROTL64;
        break;
      case RotRInt64:
        name = WASM_ROTR64;
        break;
      case MulInt64:
        name = WASM_I64_MUL;
        break;
      case DivSInt64:
        name = WASM_I64_SDIV;
        break;
      case DivUInt64:
        name = WASM_I64_UDIV;
        break;
      case RemSInt64:
        name = WASM_I64_SREM;
        break;
      case RemUInt64:
        name = WASM_I64_UREM;
        break;

      default:
        return;
    }
    neededIntrinsics.insert(name);
    replaceCurrent(
      builder->makeCall(name, {curr->left, curr->right}, curr->type));
  }